

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert_at<std::pair<int_const,int>const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          *this,size_type pos,pair<const_int,_int> *args)

{
  int iVar1;
  long lVar2;
  long lVar3;
  length_error *this_00;
  
  lVar2 = *(long *)(this + 0x48);
  if (*(long *)(this + 0x50) - lVar2 != -1) {
    if ((lVar2 == 0) ||
       (iVar1 = *(int *)(*(long *)(this + 0x70) + pos * 8),
       *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1, *(int *)(this + 0x3c) != iVar1)) {
      *(long *)(this + 0x50) = *(long *)(this + 0x50) + 1;
    }
    else {
      if (lVar2 != 0) {
        *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1;
      }
      *(long *)(this + 0x48) = lVar2 + -1;
    }
    *(pair<const_int,_int> *)(*(long *)(this + 0x70) + pos * 8) = *args;
    lVar2 = *(long *)(this + 0x58);
    lVar3 = *(long *)(this + 0x70);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar3 + pos * 8);
    __return_storage_ptr__->end = (pointer)(lVar3 + lVar2 * 8);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }